

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  int *piVar4;
  undefined8 ridx_00;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  long lVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  uint uVar24;
  byte bVar25;
  int *local_550;
  cpp_dec_float<200U,_int,_void> local_548;
  int *local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  pcVar23 = (cpp_dec_float<200U,_int,_void> *)eps2.m_backend.data._M_elems._0_8_;
  bVar25 = 0;
  puVar15 = (uint *)eps;
  puVar19 = local_b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar19 = *puVar15;
    puVar15 = puVar15 + 1;
    puVar19 = puVar19 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  puVar15 = (uint *)eps2.m_backend.data._M_elems._0_8_;
  puVar19 = local_130;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar19 = *puVar15;
    puVar15 = puVar15 + 1;
    puVar19 = puVar19 + 1;
  }
  local_c0 = *(undefined4 *)(eps2.m_backend.data._M_elems._0_8_ + 0x70);
  local_bc = *(undefined1 *)(eps2.m_backend.data._M_elems._0_8_ + 0x74);
  local_b8 = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x78);
  vSolveLright2(this,rhs,ridx,&rn,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_b0,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_130);
  if (eps2.m_backend.data._M_elems._32_8_ == 0) {
    if (rn < 1) {
      uVar24 = 0;
    }
    else {
      piVar4 = (this->row).perm;
      lVar9 = 0;
      uVar12 = 0;
      do {
        uVar24 = (uint)uVar12;
        iVar7 = ridx[lVar9];
        iVar6 = rhs[iVar7].m_backend.exp;
        bVar1 = rhs[iVar7].m_backend.neg;
        pcVar18 = &rhs[iVar7].m_backend;
        pcVar17 = &local_548;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar25 * -8 + 4);
        }
        local_548.fpclass = rhs[iVar7].m_backend.fpclass;
        local_548.prec_elem = rhs[iVar7].m_backend.prec_elem;
        pnVar16 = eps;
        pcVar18 = &local_430;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar18->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar25 * -2 + 1) * 4)
          ;
        }
        local_430.exp = (eps->m_backend).exp;
        local_430.neg = (eps->m_backend).neg;
        local_430.fpclass = (eps->m_backend).fpclass;
        local_430.prec_elem = (eps->m_backend).prec_elem;
        local_548.neg = bVar1;
        if ((bVar1 == true) &&
           (local_548.data._M_elems[0] != 0 || local_548.fpclass != cpp_dec_float_finite)) {
          local_548.neg = false;
        }
        local_548.exp = iVar6;
        if ((local_430.fpclass == cpp_dec_float_NaN || local_548.fpclass == cpp_dec_float_NaN) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_548,&local_430), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (&rhs[iVar7].m_backend,0);
        }
        else {
          iVar7 = piVar4[iVar7];
          uVar11 = uVar24;
          if (0 < (int)uVar24) {
            do {
              uVar14 = (uint)uVar12 - 1;
              uVar8 = uVar14 >> 1;
              uVar11 = (uint)uVar12;
              if (iVar7 <= ridx[uVar8]) break;
              ridx[uVar12] = ridx[uVar8];
              uVar12 = (ulong)uVar8;
              uVar11 = uVar8;
            } while (1 < uVar14);
          }
          uVar12 = (ulong)(uVar24 + 1);
          ridx[(int)uVar11] = iVar7;
        }
        lVar9 = lVar9 + 1;
        uVar24 = (int)uVar12;
      } while (lVar9 < rn);
    }
  }
  else {
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems[0x1a] = 0;
    result.m_backend.data._M_elems[0x1b] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    if (rn < 1) {
      uVar24 = 0;
    }
    else {
      local_550 = (int *)eps2.m_backend.data._M_elems._48_8_;
      local_4c0 = (this->row).perm;
      lVar9 = 0;
      uVar24 = 0;
      do {
        iVar7 = ridx[lVar9];
        lVar22 = (long)iVar7;
        lVar13 = lVar22 * 0x80;
        pcVar23 = &rhs[lVar22].m_backend;
        pcVar18 = pcVar23;
        pnVar16 = &result;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        iVar6 = rhs[lVar22].m_backend.exp;
        bVar1 = rhs[lVar22].m_backend.neg;
        fVar2 = rhs[lVar22].m_backend.fpclass;
        iVar3 = rhs[lVar22].m_backend.prec_elem;
        pcVar18 = pcVar23;
        pcVar17 = &local_548;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar25 * -8 + 4);
        }
        pnVar16 = eps;
        pcVar18 = &local_3b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar18->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar25 * -2 + 1) * 4)
          ;
        }
        local_3b0.exp = (eps->m_backend).exp;
        local_3b0.neg = (eps->m_backend).neg;
        local_3b0.fpclass = (eps->m_backend).fpclass;
        local_3b0.prec_elem = (eps->m_backend).prec_elem;
        local_548.prec_elem = iVar3;
        local_548.fpclass = fVar2;
        local_548.neg = bVar1;
        if ((bVar1 == true) && (local_548.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
          local_548.neg = false;
        }
        local_548.exp = iVar6;
        if ((local_3b0.fpclass == cpp_dec_float_NaN || fVar2 == cpp_dec_float_NaN) ||
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_548,&local_3b0), iVar5 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar23,0);
        }
        else {
          *local_550 = iVar7;
          iVar7 = local_4c0[lVar22];
          uVar11 = uVar24;
          if (0 < (int)uVar24) {
            do {
              uVar8 = uVar11 - 1;
              uVar14 = uVar8 >> 1;
              if (iVar7 <= ridx[uVar14]) break;
              ridx[uVar11] = ridx[uVar14];
              uVar11 = uVar14;
            } while (1 < uVar8);
          }
          local_550 = local_550 + 1;
          uVar24 = uVar24 + 1;
          ridx[(int)uVar11] = iVar7;
          pnVar16 = &result;
          puVar15 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + lVar13);
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar15 = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
            puVar15 = puVar15 + (ulong)bVar25 * -2 + 1;
          }
          *(int *)(eps2.m_backend.data._M_elems._32_8_ + 0x70 + lVar13) = iVar6;
          *(bool *)(eps2.m_backend.data._M_elems._32_8_ + 0x74 + lVar13) = bVar1;
          *(fpclass_type *)(eps2.m_backend.data._M_elems._32_8_ + 0x78 + lVar13) = fVar2;
          *(int32_t *)(eps2.m_backend.data._M_elems._32_8_ + 0x7c + lVar13) = iVar3;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < rn);
    }
    *(uint *)eps2.m_backend.data._M_elems._40_8_ = uVar24;
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)eps2.m_backend.data._M_elems._0_8_;
  }
  rn = uVar24;
  if ((double)this->thedim * 0.2 < (double)(int)eps2.m_backend.data._M_elems[6]) {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = this->thedim + -1;
    uVar24 = eps2.m_backend.data._M_elems[6];
  }
  else {
    local_548.fpclass = cpp_dec_float_finite;
    local_548.prec_elem = 0x1c;
    local_548.data._M_elems[0] = 0;
    local_548.data._M_elems[1] = 0;
    local_548.data._M_elems[2] = 0;
    local_548.data._M_elems[3] = 0;
    local_548.data._M_elems[4] = 0;
    local_548.data._M_elems[5] = 0;
    local_548.data._M_elems[6] = 0;
    local_548.data._M_elems[7] = 0;
    local_548.data._M_elems[8] = 0;
    local_548.data._M_elems[9] = 0;
    local_548.data._M_elems[10] = 0;
    local_548.data._M_elems[0xb] = 0;
    local_548.data._M_elems[0xc] = 0;
    local_548.data._M_elems[0xd] = 0;
    local_548.data._M_elems[0xe] = 0;
    local_548.data._M_elems[0xf] = 0;
    local_548.data._M_elems[0x10] = 0;
    local_548.data._M_elems[0x11] = 0;
    local_548.data._M_elems[0x12] = 0;
    local_548.data._M_elems[0x13] = 0;
    local_548.data._M_elems[0x14] = 0;
    local_548.data._M_elems[0x15] = 0;
    local_548.data._M_elems[0x16] = 0;
    local_548.data._M_elems[0x17] = 0;
    local_548.data._M_elems[0x18] = 0;
    local_548.data._M_elems[0x19] = 0;
    local_548.data._M_elems._104_5_ = 0;
    local_548.data._M_elems[0x1b]._1_3_ = 0;
    local_548.exp = 0;
    local_548.neg = false;
    if ((int)eps2.m_backend.data._M_elems[6] < 1) {
      uVar24 = 0;
    }
    else {
      piVar4 = (this->row).perm;
      lVar9 = 0;
      uVar12 = 0;
      do {
        uVar24 = (uint)uVar12;
        lVar22 = (long)*(int *)(eps2.m_backend.data._M_elems._16_8_ + lVar9 * 4);
        lVar10 = lVar22 * 0x80;
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)(eps2.m_backend.data._M_elems._8_8_ + lVar10);
        pcVar17 = pcVar18;
        pcVar20 = &local_548;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar25 * -8 + 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar25 * -8 + 4);
        }
        local_548.exp = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x70 + lVar10);
        local_548.neg = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x74 + lVar10);
        local_548._120_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x78 + lVar10);
        pcVar17 = pcVar23;
        pnVar16 = &result;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar25 * -8 + 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        result.m_backend.exp = pcVar23->exp;
        result.m_backend.neg = pcVar23->neg;
        result.m_backend.fpclass = pcVar23->fpclass;
        result.m_backend.prec_elem = pcVar23->prec_elem;
        if (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        uVar11 = uVar24;
        if ((result.m_backend.fpclass == cpp_dec_float_NaN || local_548.fpclass == cpp_dec_float_NaN
            ) || (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_548,&result.m_backend), -1 < iVar7)) {
          if (((local_548.fpclass != cpp_dec_float_NaN) && (pcVar23->fpclass != cpp_dec_float_NaN))
             && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_548,pcVar23), 0 < iVar7)) {
            iVar7 = piVar4[lVar22];
            if (0 < (int)uVar24) {
              do {
                uVar14 = (uint)uVar12 - 1;
                uVar8 = uVar14 >> 1;
                iVar6 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar8 * 4);
                uVar11 = (uint)uVar12;
                if (iVar7 <= iVar6) break;
                *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar12 * 4) = iVar6;
                uVar12 = (ulong)uVar8;
                uVar11 = uVar8;
              } while (1 < uVar14);
            }
            goto LAB_0053fef5;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar18,0);
        }
        else {
          iVar7 = piVar4[lVar22];
          if (0 < (int)uVar24) {
            do {
              uVar14 = (uint)uVar12 - 1;
              uVar8 = uVar14 >> 1;
              iVar6 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar8 * 4);
              uVar11 = (uint)uVar12;
              if (iVar7 <= iVar6) break;
              *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar12 * 4) = iVar6;
              uVar12 = (ulong)uVar8;
              uVar11 = uVar8;
            } while (1 < uVar14);
          }
LAB_0053fef5:
          uVar12 = (ulong)(uVar24 + 1);
          *(int *)(eps2.m_backend.data._M_elems._16_8_ + (long)(int)uVar11 * 4) = iVar7;
        }
        lVar9 = lVar9 + 1;
        uVar24 = (uint)uVar12;
      } while (lVar9 < (int)eps2.m_backend.data._M_elems[6]);
    }
  }
  eps2.m_backend.data._M_elems[6] = uVar24;
  ridx_00 = eps2.m_backend.data._M_elems._16_8_;
  pnVar16 = eps;
  pnVar21 = &local_1b0;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar21->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
    pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = (eps->m_backend).exp;
  local_1b0.m_backend.neg = (eps->m_backend).neg;
  local_1b0.m_backend.fpclass = (eps->m_backend).fpclass;
  local_1b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = vSolveUright(this,vec,idx,rhs,ridx,rn,&local_1b0);
  pcVar18 = pcVar23;
  pnVar16 = &local_230;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = pcVar23->exp;
  local_230.m_backend.neg = pcVar23->neg;
  local_230.m_backend.fpclass = pcVar23->fpclass;
  local_230.m_backend.prec_elem = pcVar23->prec_elem;
  vSolveUrightNoNZ(this,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)ridx_00,
                   eps2.m_backend.data._M_elems[6],&local_230);
  if ((this->l).updateType == 0) {
    pnVar16 = eps;
    pnVar21 = &local_2b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar21->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = (eps->m_backend).exp;
    local_2b0.m_backend.neg = (eps->m_backend).neg;
    local_2b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_2b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this,vec,idx,rn,&local_2b0);
    pcVar18 = pcVar23;
    pnVar16 = &local_330;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar25 * -8 + 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = pcVar23->exp;
    local_330.m_backend.neg = pcVar23->neg;
    local_330.m_backend.fpclass = pcVar23->fpclass;
    local_330.m_backend.prec_elem = pcVar23->prec_elem;
    vSolveUpdateRightNoNZ(this,vec2,&local_330);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}